

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O2

bool __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::exists
          (KDTree<phosg::Vector2<long>,_long> *this,Vector2<long> *low,Vector2<long> *high)

{
  anon_union_8_2_94730018_for_Vector2<long>_1 *paVar1;
  Node *pNVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  level_nodes;
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  local_80;
  
  if (this->root == (Node *)0x0) {
    bVar6 = false;
  }
  else {
    ::std::
    _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::_Deque_base(&local_80);
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
    ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*const&>
              ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                *)&local_80,&this->root);
    while( true ) {
      bVar6 = local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_80._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      pNVar2 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
      ::std::
      deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ::pop_front((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                   *)&local_80);
      lVar5 = 0;
      do {
        if (lVar5 == 2) goto LAB_001074e0;
        lVar3 = (&(pNVar2->pt).field_0)[lVar5].x;
      } while (((&low->field_0)[lVar5].x <= lVar3) &&
              (paVar1 = &high->field_0 + lVar5, lVar5 = lVar5 + 1, lVar3 < paVar1->x));
      sVar4 = pNVar2->dim;
      lVar5 = (&(pNVar2->pt).field_0)[sVar4].x;
      lVar3 = (&high->field_0)[sVar4].x;
      if (((&low->field_0)[sVar4].x < lVar5) && (pNVar2->before != (Node *)0x0)) {
        ::std::
        deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
        ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                  ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                    *)&local_80,&pNVar2->before);
      }
      if ((lVar5 <= lVar3) && (pNVar2->after_or_equal != (Node *)0x0)) {
        ::std::
        deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
        ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                  ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                    *)&local_80,&pNVar2->after_or_equal);
      }
    }
LAB_001074e0:
    ::std::
    _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::~_Deque_base(&local_80);
  }
  return bVar6;
}

Assistant:

bool KDTree<CoordType, ValueType>::exists(const CoordType& low,
    const CoordType& high) const {
  if (this->root == nullptr) {
    return false;
  }

  std::deque<Node*> level_nodes;
  level_nodes.emplace_back(this->root);
  while (!level_nodes.empty()) {
    Node* n = level_nodes.front();
    level_nodes.pop_front();

    // if this node is within the range, return it
    {
      size_t dim;
      for (dim = 0; dim < CoordType::dimensions(); dim++) {
        if ((n->pt.at(dim) < low.at(dim)) ||
            (n->pt.at(dim) >= high.at(dim))) {
          break;
        }
      }
      if (dim == CoordType::dimensions()) {
        return true;
      }
    }

    // if the range falls entirely on one side of the node, move down to that
    // node. otherwise, move down to both nodes
    bool low_less = (low.at(n->dim) < n->pt.at(n->dim));
    bool high_greater = (high.at(n->dim) >= n->pt.at(n->dim));
    if (low_less && n->before) {
      level_nodes.emplace_back(n->before);
    }
    if (high_greater && n->after_or_equal) {
      level_nodes.emplace_back(n->after_or_equal);
    }
  }
  return false;
}